

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O3

void insert_empty_rule(void)

{
  bucket **ppbVar1;
  Yshort *pYVar2;
  bucket *pbVar3;
  bucket **ppbVar4;
  long lVar5;
  
  if (cache != (char *)0x0) {
    gensym = gensym + 1;
    sprintf(cache,"$$%d");
    pbVar3 = make_bucket(cache);
    last_symbol->next = pbVar3;
    last_symbol = pbVar3;
    pbVar3->tag = plhs[nrules]->tag;
    pbVar3->class = '\x03';
    pbVar3->args = 0;
    pbVar3->trialaction = trialaction;
    nitems = nitems + 2;
    if (maxitems < nitems) {
      expand_items();
    }
    ppbVar4 = pitem + (long)nitems + -2;
    pitem[(long)nitems + -1] = pbVar3;
    do {
      ppbVar1 = ppbVar4 + -1;
      *ppbVar4 = *ppbVar1;
      ppbVar4 = ppbVar4 + -1;
    } while (*ppbVar1 != (bucket *)0x0);
    nrules = nrules + 1;
    if (maxrules <= nrules) {
      expand_rules();
    }
    ppbVar4 = plhs;
    lVar5 = (long)nrules;
    plhs[lVar5] = plhs[lVar5 + -1];
    ppbVar4[lVar5 + -1] = pbVar3;
    pYVar2 = rprec;
    rprec[lVar5] = rprec[lVar5 + -1];
    pYVar2[(long)nrules + -1] = 0;
    rassoc[nrules] = rassoc[(long)nrules + -1];
    rassoc[(long)nrules + -1] = '\0';
    return;
  }
  __assert_fail("cache",
                "/workspace/llm4binary/github/license_c_cmakelists/ChrisDodd[P]btyacc/reader.c",
                0x54d,"void insert_empty_rule()");
}

Assistant:

void insert_empty_rule()
{
    register bucket *bp, **bpp;

    assert(cache);
    sprintf(cache, "$$%d", ++gensym);
    bp = make_bucket(cache);
    last_symbol->next = bp;
    last_symbol = bp;
    bp->tag = plhs[nrules]->tag;
    bp->class = ACTION;
    bp->args = 0;
    bp->trialaction = trialaction;

    if ((nitems += 2) > maxitems)
	expand_items();
    bpp = pitem + nitems - 1;
    *bpp-- = bp;
    while ((bpp[0] = bpp[-1])) --bpp;

    if (++nrules >= maxrules)
	expand_rules();
    plhs[nrules] = plhs[nrules-1];
    plhs[nrules-1] = bp;
    rprec[nrules] = rprec[nrules-1];
    rprec[nrules-1] = 0;
    rassoc[nrules] = rassoc[nrules-1];
    rassoc[nrules-1] = TOKEN;
}